

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_buffer.cpp
# Opt level: O2

void __thiscall cubeb_ring_buffer_Test::TestBody(cubeb_ring_buffer_Test *this)

{
  size_t channels;
  int channel_count;
  size_t capacity_frames;
  ulong uVar1;
  long lVar2;
  lock_free_audio_ring_buffer<float> q3;
  lock_free_queue<short> q2;
  lock_free_queue<float> q1;
  lock_free_audio_ring_buffer<short> q4;
  
  ring_buffer_base<float>::ring_buffer_base(&q1,0x80);
  basic_api_test<ring_buffer_base<float>>(&q1);
  ring_buffer_base<short>::ring_buffer_base(&q2,0x80);
  basic_api_test<ring_buffer_base<short>>(&q2);
  for (lVar2 = -9; lVar2 != 0; lVar2 = lVar2 + 1) {
    channel_count = (int)lVar2 + 10;
    audio_ring_buffer_base<float>::audio_ring_buffer_base(&q3,channel_count,0x80);
    basic_api_test<audio_ring_buffer_base<float>>(&q3);
    audio_ring_buffer_base<short>::audio_ring_buffer_base(&q4,channel_count,0x80);
    basic_api_test<audio_ring_buffer_base<short>>(&q4);
    std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr(&q4.ring_buffer.data_);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&q3.ring_buffer.data_);
  }
  for (lVar2 = 1; lVar2 != 10; lVar2 = lVar2 + 1) {
    for (uVar1 = 199; uVar1 < 0x4fd; uVar1 = uVar1 + 0x1b) {
      audio_ring_buffer_base<float>::audio_ring_buffer_base(&q3,(int)lVar2,(int)uVar1);
      test_ring<float>(&q3,(int)lVar2,(int)uVar1);
      std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&q3.ring_buffer.data_);
    }
  }
  for (lVar2 = 1; lVar2 != 10; lVar2 = lVar2 + 1) {
    for (uVar1 = 199; uVar1 < 0x4fd; uVar1 = uVar1 + 0x1b) {
      audio_ring_buffer_base<short>::audio_ring_buffer_base
                ((audio_ring_buffer_base<short> *)&q3,(int)lVar2,(int)uVar1);
      test_ring_multi<short>((lock_free_audio_ring_buffer<short> *)&q3,(int)lVar2,(int)uVar1);
      std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr
                ((unique_ptr<short[],_std::default_delete<short[]>_> *)&q3.ring_buffer.data_);
    }
  }
  test_reset_api();
  std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr(&q2.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&q1.data_);
  return;
}

Assistant:

TEST(cubeb, ring_buffer)
{
  /* Basic API test. */
  const int min_channels = 1;
  const int max_channels = 10;
  const int min_capacity = 199;
  const int max_capacity = 1277;
  const int capacity_increment = 27;

  lock_free_queue<float> q1(128);
  basic_api_test(q1);
  lock_free_queue<short> q2(128);
  basic_api_test(q2);

  for (size_t channels = min_channels; channels < max_channels; channels++) {
    lock_free_audio_ring_buffer<float> q3(channels, 128);
    basic_api_test(q3);
    lock_free_audio_ring_buffer<short> q4(channels, 128);
    basic_api_test(q4);
  }

  /* Single thread testing. */
  /* Test mono to 9.1 */
  for (size_t channels = min_channels; channels < max_channels; channels++) {
    /* Use non power-of-two numbers to catch edge-cases. */
    for (size_t capacity_frames = min_capacity;
         capacity_frames < max_capacity; capacity_frames+=capacity_increment) {
      lock_free_audio_ring_buffer<float> ring(channels, capacity_frames);
      test_ring(ring, channels, capacity_frames);
    }
  }

  /* Multi thread testing */
  for (size_t channels = min_channels; channels < max_channels; channels++) {
    /* Use non power-of-two numbers to catch edge-cases. */
    for (size_t capacity_frames = min_capacity;
         capacity_frames < max_capacity; capacity_frames+=capacity_increment) {
      lock_free_audio_ring_buffer<short> ring(channels, capacity_frames);
      test_ring_multi(ring, channels, capacity_frames);
    }
  }

  test_reset_api();
}